

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSLSocket.cpp
# Opt level: O1

int __thiscall blc::network::SSLSocket::open(SSLSocket *this,char *__file,int __oflag,...)

{
  ushort uVar1;
  int iVar2;
  in_addr_t iVar3;
  hostent *phVar4;
  int *piVar5;
  SSL_METHOD *meth;
  SSL_CTX *ctx;
  SSL *s;
  exception *peVar6;
  long *plVar7;
  long *plVar8;
  size_type *psVar9;
  sockaddr_in addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  sockaddr local_100;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar2 = std::__cxx11::string::compare((char *)&this->_address);
  if ((iVar2 == 0) || (this->_port == 0)) {
    peVar6 = (exception *)__cxa_allocate_exception(0x78);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"non set connection","");
    error::exception::exception(peVar6,&local_50);
    __cxa_throw(peVar6,&error::exception::typeinfo,error::exception::~exception);
  }
  if (this->_opened == false) {
    iVar2 = socket(this->_type,(this->_block ^ 1) << 0xb | this->_mode,0);
    *(int *)&(this->super_Socket).field_0x44 = iVar2;
    if (iVar2 == -1) {
      peVar6 = (exception *)__cxa_allocate_exception(0x78);
      local_160[0] = local_150;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_160,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/BHC-IT[P]blc/src/SSLSocket.cpp"
                 ,"");
      plVar7 = (long *)std::__cxx11::string::append((char *)local_160);
      local_1a0 = (long *)*plVar7;
      plVar8 = plVar7 + 2;
      if (local_1a0 == plVar8) {
        local_190 = *plVar8;
        lStack_188 = plVar7[3];
        local_1a0 = &local_190;
      }
      else {
        local_190 = *plVar8;
      }
      local_198 = plVar7[1];
      *plVar7 = (long)plVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
      local_180 = (long *)*plVar7;
      plVar8 = plVar7 + 2;
      if (local_180 == plVar8) {
        local_170 = *plVar8;
        lStack_168 = plVar7[3];
        local_180 = &local_170;
      }
      else {
        local_170 = *plVar8;
      }
      local_178 = plVar7[1];
      *plVar7 = (long)plVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_180);
      local_1e0._M_dataplus._M_p = (pointer)*plVar7;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_1e0._M_dataplus._M_p == psVar9) {
        local_1e0.field_2._M_allocated_capacity = *psVar9;
        local_1e0.field_2._8_8_ = plVar7[3];
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      }
      else {
        local_1e0.field_2._M_allocated_capacity = *psVar9;
      }
      local_1e0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::to_string(&local_140,0xbe);
      std::operator+(&local_120,&local_1e0,&local_140);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_120);
      local_1c0 = (long *)*plVar7;
      plVar8 = plVar7 + 2;
      if (local_1c0 == plVar8) {
        local_1b0 = *plVar8;
        lStack_1a8 = plVar7[3];
        local_1c0 = &local_1b0;
      }
      else {
        local_1b0 = *plVar8;
      }
      local_1b8 = plVar7[1];
      *plVar7 = (long)plVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      piVar5 = __errno_location();
      strerror(*piVar5);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_1c0);
      local_b0._M_dataplus._M_p = (pointer)*plVar7;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar9) {
        local_b0.field_2._M_allocated_capacity = *psVar9;
        local_b0.field_2._8_8_ = plVar7[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar9;
      }
      local_b0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      error::exception::exception(peVar6,&local_b0);
      __cxa_throw(peVar6,&error::exception::typeinfo,error::exception::~exception);
    }
    local_100.sa_family = 2;
    uVar1 = (ushort)this->_port;
    local_100.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
    local_100.sa_data._2_4_ = inet_addr((this->_address)._M_dataplus._M_p);
    iVar3 = inet_addr((this->_address)._M_dataplus._M_p);
    if (iVar3 == 0xffffffff) {
      phVar4 = gethostbyname((this->_address)._M_dataplus._M_p);
      if (phVar4 == (hostent *)0x0) {
        peVar6 = (exception *)__cxa_allocate_exception(0x78);
        local_160[0] = local_150;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_160,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BHC-IT[P]blc/src/SSLSocket.cpp"
                   ,"");
        plVar7 = (long *)std::__cxx11::string::append((char *)local_160);
        local_1a0 = (long *)*plVar7;
        plVar8 = plVar7 + 2;
        if (local_1a0 == plVar8) {
          local_190 = *plVar8;
          lStack_188 = plVar7[3];
          local_1a0 = &local_190;
        }
        else {
          local_190 = *plVar8;
        }
        local_198 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
        local_180 = (long *)*plVar7;
        plVar8 = plVar7 + 2;
        if (local_180 == plVar8) {
          local_170 = *plVar8;
          lStack_168 = plVar7[3];
          local_180 = &local_170;
        }
        else {
          local_170 = *plVar8;
        }
        local_178 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_180);
        local_1e0._M_dataplus._M_p = (pointer)*plVar7;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_1e0._M_dataplus._M_p == psVar9) {
          local_1e0.field_2._M_allocated_capacity = *psVar9;
          local_1e0.field_2._8_8_ = plVar7[3];
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        }
        else {
          local_1e0.field_2._M_allocated_capacity = *psVar9;
        }
        local_1e0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::to_string(&local_140,0xca);
        std::operator+(&local_120,&local_1e0,&local_140);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_120);
        local_1c0 = (long *)*plVar7;
        plVar8 = plVar7 + 2;
        if (local_1c0 == plVar8) {
          local_1b0 = *plVar8;
          lStack_1a8 = plVar7[3];
          local_1c0 = &local_1b0;
        }
        else {
          local_1b0 = *plVar8;
        }
        local_1b8 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        piVar5 = __errno_location();
        strerror(*piVar5);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_d0._M_dataplus._M_p = (pointer)*plVar7;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_d0._M_dataplus._M_p == psVar9) {
          local_d0.field_2._M_allocated_capacity = *psVar9;
          local_d0.field_2._8_8_ = plVar7[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar9;
        }
        local_d0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        error::exception::exception(peVar6,&local_d0);
        __cxa_throw(peVar6,&error::exception::typeinfo,error::exception::~exception);
      }
      if ((in_addr_t *)*phVar4->h_addr_list != (in_addr_t *)0x0) {
        local_100.sa_data._2_4_ = *(undefined4 *)*phVar4->h_addr_list;
      }
    }
    iVar2 = connect(*(int *)&(this->super_Socket).field_0x44,&local_100,0x10);
    if (iVar2 < 0) {
      piVar5 = __errno_location();
      if (*piVar5 != 0x73) {
        peVar6 = (exception *)__cxa_allocate_exception(0x78);
        local_160[0] = local_150;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_160,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BHC-IT[P]blc/src/SSLSocket.cpp"
                   ,"");
        plVar7 = (long *)std::__cxx11::string::append((char *)local_160);
        local_1a0 = (long *)*plVar7;
        plVar8 = plVar7 + 2;
        if (local_1a0 == plVar8) {
          local_190 = *plVar8;
          lStack_188 = plVar7[3];
          local_1a0 = &local_190;
        }
        else {
          local_190 = *plVar8;
        }
        local_198 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
        local_180 = (long *)*plVar7;
        plVar8 = plVar7 + 2;
        if (local_180 == plVar8) {
          local_170 = *plVar8;
          lStack_168 = plVar7[3];
          local_180 = &local_170;
        }
        else {
          local_170 = *plVar8;
        }
        local_178 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_180);
        local_1e0._M_dataplus._M_p = (pointer)*plVar7;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_1e0._M_dataplus._M_p == psVar9) {
          local_1e0.field_2._M_allocated_capacity = *psVar9;
          local_1e0.field_2._8_8_ = plVar7[3];
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        }
        else {
          local_1e0.field_2._M_allocated_capacity = *psVar9;
        }
        local_1e0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::to_string(&local_140,0xd2);
        std::operator+(&local_120,&local_1e0,&local_140);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_120);
        local_1c0 = (long *)*plVar7;
        plVar8 = plVar7 + 2;
        if (local_1c0 == plVar8) {
          local_1b0 = *plVar8;
          lStack_1a8 = plVar7[3];
          local_1c0 = &local_1b0;
        }
        else {
          local_1b0 = *plVar8;
        }
        local_1b8 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        strerror(*piVar5);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_f0._M_dataplus._M_p = (pointer)*plVar7;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_f0._M_dataplus._M_p == psVar9) {
          local_f0.field_2._M_allocated_capacity = *psVar9;
          local_f0.field_2._8_8_ = plVar7[3];
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar9;
        }
        local_f0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        error::exception::exception(peVar6,&local_f0);
        __cxa_throw(peVar6,&error::exception::typeinfo,error::exception::~exception);
      }
    }
    this->_opened = true;
    meth = (SSL_METHOD *)TLS_client_method();
    ctx = SSL_CTX_new(meth);
    s = SSL_new(ctx);
    this->_ssl = (SSL *)s;
    if (s == (SSL *)0x0) {
      log_ssl();
      peVar6 = (exception *)__cxa_allocate_exception(0x78);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Error creating SSL","");
      error::exception::exception(peVar6,&local_70);
      __cxa_throw(peVar6,&error::exception::typeinfo,error::exception::~exception);
    }
    SSL_get_fd(s);
    SSL_set_fd((SSL *)this->_ssl,*(int *)&(this->super_Socket).field_0x44);
    iVar2 = SSL_connect((SSL *)this->_ssl);
    if (iVar2 < 1) {
      log_ssl();
      peVar6 = (exception *)__cxa_allocate_exception(0x78);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Error creating SSL connection","");
      error::exception::exception(peVar6,&local_90);
      __cxa_throw(peVar6,&error::exception::typeinfo,error::exception::~exception);
    }
    do {
      iVar2 = (*(this->super_Socket).super_stream._vptr_stream[5])(this);
    } while ((char)iVar2 == '\0');
  }
  return iVar2;
}

Assistant:

void blc::network::SSLSocket::open() {
	struct sockaddr_in addr;

	if (this->_address == "" || this->_port == 0)
		throw blc::error::exception("non set connection");
	else if (this->_opened == true)
		return;
	this->_socket = ::socket(this->_type, this->_mode | (SOCK_NONBLOCK * (1 - this->_block)), 0);
	if (this->_socket == -1)
		throw blc::error::exception(assertError(strerror(errno)));
	#ifdef __WIN32
		u_long mode = !this->_block;
		ioctlsocket(this->_socket, FIONBIO, &mode);
	#endif
	addr.sin_family = AF_INET;
	addr.sin_port = htons(this->_port);
	addr.sin_addr.s_addr = inet_addr(this->_address.c_str());
	if(inet_addr(this->_address.c_str()) == INADDR_NONE) {
		struct hostent *he;
		struct in_addr **addr_list;
		if ( (he = gethostbyname( this->_address.c_str() ) ) == NULL)
			throw blc::error::exception(assertError(strerror(errno)));
		addr_list = (struct in_addr **) he->h_addr_list;
		for(int i = 0; addr_list[i] != NULL; i++) {
			addr.sin_addr = *addr_list[i];
			break;
		}
	}
	if (connect(this->_socket, (struct sockaddr *)&addr, sizeof(addr)) < 0 && errno != EINPROGRESS)
		throw blc::error::exception(assertError(strerror(errno)));
	this->_opened = true;
	const SSL_METHOD *meth = SSLv23_client_method();
	SSL_CTX *ctx = SSL_CTX_new (meth);
	this->_ssl = SSL_new (ctx);
	if (!this->_ssl) {
		log_ssl();
		throw blc::error::exception("Error creating SSL");
	}
	SSL_get_fd(this->_ssl);
	SSL_set_fd(this->_ssl, this->_socket);
	if (SSL_connect(this->_ssl) <= 0) {
		log_ssl();
		throw blc::error::exception("Error creating SSL connection");
	}
	while (this->writable() == false) continue;
}